

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O0

void __thiscall avro::json::JsonGenerator::sep(JsonGenerator *this)

{
  size_t in_RCX;
  void *in_RDX;
  StreamWriter *in_RDI;
  
  if (*(int *)&in_RDI[4].next_ == 2) {
    StreamWriter::write(in_RDI,0x2c,in_RDX,in_RCX);
  }
  else if (*(int *)&in_RDI[4].next_ == 1) {
    *(undefined4 *)&in_RDI[4].next_ = 2;
  }
  return;
}

Assistant:

void sep() {
        if (top == stArrayN) {
            out_.write(',');
        } else if (top == stArray0) {
            top = stArrayN;
        }
    }